

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Mesh::draw(Mesh *this)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar1;
  float fVar2;
  Scene *pSVar3;
  _List_node_base *p_Var4;
  double *pdVar5;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> offsets;
  Vector3D offset;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> local_78;
  Vector3D local_60;
  value_type local_48;
  
  local_78.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar1 = &(this->mesh).vertices;
  p_Var4 = (this->mesh).vertices.super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)plVar1) {
    do {
      fVar2 = *(float *)((long)&p_Var4[6]._M_prev + 4);
      Vertex::normal(&local_60,(Vertex *)(p_Var4 + 1));
      local_48.z = (double)fVar2;
      local_48.x = local_60.x * local_48.z;
      local_48.y = local_60.y * local_48.z;
      local_48.z = local_48.z * local_60.z;
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
                (&local_78,&local_48);
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)plVar1);
  }
  p_Var4 = (plVar1->super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)plVar1) {
    pdVar5 = &(local_78.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start)->z;
    do {
      p_Var4[1]._M_prev =
           (_List_node_base *)(((Vector3D *)(pdVar5 + -2))->x + (double)p_Var4[1]._M_prev);
      p_Var4[2]._M_next = (_List_node_base *)(pdVar5[-1] + (double)p_Var4[2]._M_next);
      p_Var4[2]._M_prev = (_List_node_base *)(*pdVar5 + (double)p_Var4[2]._M_prev);
      p_Var4 = p_Var4->_M_next;
      pdVar5 = pdVar5 + 3;
    } while (p_Var4 != (_List_node_base *)plVar1);
  }
  glPushMatrix();
  glTranslatef((float)(this->super_SceneObject).position.x,
               (float)(this->super_SceneObject).position.y,
               (float)(this->super_SceneObject).position.z);
  glRotatef((float)(this->super_SceneObject).rotation.x,0x3f800000,0,0);
  glRotatef((float)(this->super_SceneObject).rotation.y,0,0x3f800000,0);
  glRotatef((float)(this->super_SceneObject).rotation.z,0,0,0x3f800000);
  glScalef((float)(this->super_SceneObject).scale.x,(float)(this->super_SceneObject).scale.y,
           (float)(this->super_SceneObject).scale.z);
  glDisable(0xbe2);
  glEnable(0xb50);
  draw_faces(this,false);
  glEnable(0xbe2);
  glBlendFunc(0x302,0x303);
  glDisable(0xb50);
  draw_edges(this);
  pSVar3 = (this->super_SceneObject).scene;
  if (pSVar3 != (Scene *)0x0) {
    draw_feature_if_needed(this,&pSVar3->selected);
    draw_feature_if_needed(this,&((this->super_SceneObject).scene)->hovered);
  }
  glEnable(0xb50);
  glDisable(0xbe2);
  glPopMatrix();
  p_Var4 = (plVar1->super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)plVar1) {
    pdVar5 = &(local_78.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start)->z;
    do {
      p_Var4[1]._M_prev =
           (_List_node_base *)((double)p_Var4[1]._M_prev - ((Vector3D *)(pdVar5 + -2))->x);
      p_Var4[2]._M_next = (_List_node_base *)((double)p_Var4[2]._M_next - pdVar5[-1]);
      p_Var4[2]._M_prev = (_List_node_base *)((double)p_Var4[2]._M_prev - *pdVar5);
      p_Var4 = p_Var4->_M_next;
      pdVar5 = pdVar5 + 3;
    } while (p_Var4 != (_List_node_base *)plVar1);
  }
  if (local_78.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Mesh::draw() {

  vector<Vector3D> offsets;

  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    Vector3D offset = v->offset * v->normal();
    offsets.push_back(offset);
  }

  int i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position += offsets[i++];
  }

  glPushMatrix();
  glTranslatef(position.x, position.y, position.z);
  glRotatef(rotation.x, 1.0f, 0.0f, 0.0f);
  glRotatef(rotation.y, 0.0f, 1.0f, 0.0f);
  glRotatef(rotation.z, 0.0f, 0.0f, 1.0f);
  glScalef(scale.x, scale.y, scale.z);

  glDisable( GL_BLEND );

	// Enable lighting for faces
  glEnable(GL_LIGHTING);
  draw_faces(false);

   glEnable( GL_BLEND );
   glBlendFunc( GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA );

  // Edges are drawn with flat shading.
  glDisable(GL_LIGHTING);
  draw_edges();

  // ONLY draw a vertex/half-edge if it's selected.
  if( scene )
  {
     draw_feature_if_needed( &scene->selected );
     draw_feature_if_needed( &scene->hovered );
  }

  glEnable(GL_LIGHTING);
  glDisable( GL_BLEND );

  glPopMatrix();

  i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position -= offsets[i++];
  }
}